

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::TAY(CPU *this)

{
  byte bVar1;
  
  bVar1 = this->A;
  this->Y = bVar1;
  this->field_0x2e = bVar1 >> 7 | (bVar1 == 0) << 6 | this->field_0x2e & 0xbe;
  return;
}

Assistant:

void CPU::TAY() {
	Y = A;
	if (Y == 0) {
		Z = 1;
	} else {
		Z = 0;
	}
	if (Y & (1 << 7)) {
		N = 1;
	} else {
		N = 0;
	}
}